

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O1

size_t __thiscall gui::MenuBar::findMenuIndex(MenuBar *this,String *name)

{
  pointer pMVar1;
  bool bVar2;
  out_of_range *this_00;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  pMVar1 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>._M_impl.
          super__Vector_impl_data._M_finish != pMVar1;
  if (bVar5) {
    bVar2 = sf::operator==(&pMVar1->name,name);
    if (bVar2) {
      uVar4 = 0;
    }
    else {
      lVar3 = 0x50;
      uVar4 = 0;
      do {
        uVar4 = uVar4 + 1;
        pMVar1 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar5 = uVar4 < (ulong)(((long)(this->menus_).
                                       super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >>
                                4) * -0x3333333333333333);
        if (!bVar5) goto LAB_0014140f;
        bVar2 = sf::operator==((String *)((long)&(pMVar1->name).m_string._M_dataplus + lVar3),name);
        lVar3 = lVar3 + 0x50;
      } while (!bVar2);
    }
    if (bVar5) {
      return uVar4;
    }
  }
LAB_0014140f:
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"MenuBar::findMenuIndex");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

size_t MenuBar::findMenuIndex(const sf::String& name) const {
    for (size_t i = 0; i < menus_.size(); ++i) {
        if (menus_[i].name == name) {
            return i;
        }
    }
    throw std::out_of_range("MenuBar::findMenuIndex");
}